

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_deleteRows(HModel *this,int firstrow,int lastrow)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  iVar13 = 0;
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n");
  std::ostream::flush();
  iVar1 = (lastrow - firstrow) + 1;
  if (lastrow - firstrow != 0 && firstrow <= lastrow) {
    pdVar6 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)firstrow;
    lVar10 = lastrow - lVar8;
    do {
      pdVar6[lVar8] = pdVar6[iVar1 + lVar8];
      pdVar7[lVar8] = pdVar7[iVar1 + lVar8];
      pdVar6 = pdVar6 + 1;
      pdVar7 = pdVar7 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  iVar9 = this->numCol;
  if (0 < iVar9) {
    piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar13 = 0;
    lVar8 = 0;
    do {
      iVar9 = piVar4[lVar8];
      lVar11 = (long)iVar9;
      piVar4[lVar8] = iVar13;
      lVar10 = lVar8 + 1;
      if (iVar9 < piVar4[lVar8 + 1]) {
        pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar9 = piVar5[lVar11];
          if (iVar9 < firstrow || lastrow < iVar9) {
            iVar12 = iVar1;
            if (iVar9 < firstrow) {
              iVar12 = 0;
            }
            piVar5[iVar13] = iVar9 - iVar12;
            pdVar6[iVar13] = pdVar6[lVar11];
            iVar13 = iVar13 + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < piVar4[lVar10]);
      }
      iVar9 = this->numCol;
      lVar8 = lVar10;
    } while (lVar10 < iVar9);
  }
  (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar9] = iVar13;
  uVar2 = this->numRow;
  uVar3 = this->numTot;
  this->numRow = uVar2 - iVar1;
  this->numTot = uVar3 - iVar1;
  mlFg_Update(this,this->mlFg_action_DelRows);
  return;
}

Assistant:

void HModel::util_deleteRows(int firstrow, int lastrow) {
  assert(firstrow >= 0);
  assert(lastrow < numRow);
  assert(firstrow <= lastrow);
#ifdef JAJH_dev
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n", firstrow, lastrow);cout << flush;
#endif
  int rowStep = lastrow-firstrow+1;
  for (int row = firstrow; row < lastrow; row++) {
    rowLower[row] = rowLower[rowStep+row];
    rowUpper[row] = rowUpper[rowStep+row];
    //    rowScale[row] = rowScale[rowStep+row];
  }

  int nnz = 0;
  for (int col = 0; col < numCol; col++) {
    int fmEl = Astart[col];
    Astart[col] = nnz;
    for (int el = fmEl; el < Astart[col+1]; el++) {
      int row = Aindex[el];
      if (row < firstrow || row > lastrow) {
	if (row < firstrow) {
	  Aindex[nnz] = row;
	} else {
	  Aindex[nnz] = row-rowStep;
	}
	Avalue[nnz] = Avalue[el];
	nnz++;
      }
    }
  }
  Astart[numCol] = nnz;

  //Reduce the number of rows and total number of variables in the model
  numRow -= rowStep;
  numTot -= rowStep;

  //Determine consequences for basis when deleting rows
  mlFg_Update(mlFg_action_DelRows);
 
}